

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlfield.cpp
# Opt level: O2

void __thiscall QSqlField::setTableName(QSqlField *this,QString *tableName)

{
  QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach(&this->d);
  QString::operator=(&((this->d).d.ptr)->table,tableName);
  return;
}

Assistant:

void QSqlField::setTableName(const QString &tableName)
{
    detach();
    d->table = tableName;
}